

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteInvalidModule
          (BinaryWriterSpec *this,ScriptModule *module,string_view text)

{
  ScriptModuleType SVar1;
  int iVar2;
  undefined4 extraout_var;
  size_type extraout_RDX;
  string_view filename_00;
  string_view local_98;
  char *local_88;
  size_type local_80;
  string_view local_78;
  string_view local_68;
  undefined1 local_58 [8];
  string filename;
  char *module_type;
  char *extension;
  ScriptModule *module_local;
  BinaryWriterSpec *this_local;
  string_view text_local;
  
  module_type = "";
  filename.field_2._8_8_ = (long)"\n\n" + 2;
  SVar1 = ScriptModule::type(module);
  if (SVar1 == Text) {
    module_type = kWasmExtension;
    filename.field_2._8_8_ = anon_var_dwarf_c365e;
  }
  else if (SVar1 == Binary) {
    module_type = kWasmExtension;
    filename.field_2._8_8_ = anon_var_dwarf_c365e;
  }
  else if (SVar1 == Quoted) {
    module_type = kWatExtension;
    filename.field_2._8_8_ = anon_var_dwarf_bea68;
  }
  iVar2 = (*module->_vptr_ScriptModule[2])();
  WriteLocation(this,(Location *)CONCAT44(extraout_var,iVar2));
  WriteSeparator(this);
  (anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_
            ((string *)local_58,this,module_type);
  WriteKey(this,"filename");
  string_view::string_view(&local_78,(string *)local_58);
  filename_00.size_ = extraout_RDX;
  filename_00.data_ = (char *)local_78.size_;
  local_68 = GetBasename((wabt *)local_78.data_,filename_00);
  WriteEscapedString(this,local_68);
  WriteSeparator(this);
  WriteKey(this,"text");
  local_88 = text.data_;
  local_80 = text.size_;
  WriteEscapedString(this,text);
  WriteSeparator(this);
  WriteKey(this,"module_type");
  WriteString(this,(char *)filename.field_2._8_8_);
  string_view::string_view(&local_98,(string *)local_58);
  WriteScriptModule(this,local_98,module);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void BinaryWriterSpec::WriteInvalidModule(const ScriptModule& module,
                                          string_view text) {
  const char* extension = "";
  const char* module_type = "";
  switch (module.type()) {
    case ScriptModuleType::Text:
      extension = kWasmExtension;
      module_type = "binary";
      break;

    case ScriptModuleType::Binary:
      extension = kWasmExtension;
      module_type = "binary";
      break;

    case ScriptModuleType::Quoted:
      extension = kWatExtension;
      module_type = "text";
      break;
  }

  WriteLocation(module.location());
  WriteSeparator();
  std::string filename = GetModuleFilename(extension);
  WriteKey("filename");
  WriteEscapedString(GetBasename(filename));
  WriteSeparator();
  WriteKey("text");
  WriteEscapedString(text);
  WriteSeparator();
  WriteKey("module_type");
  WriteString(module_type);
  WriteScriptModule(filename, module);
}